

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O2

void __thiscall trng::negative_binomial_dist::param_type::calc_probabilities(param_type *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  int x;
  double p;
  _Vector_base<double,_std::allocator<double>_> local_48;
  double local_28;
  
  this_00 = &this->P_;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(this_00,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  x = 0;
  while ((double)local_48._M_impl.super__Vector_impl_data._M_start < 0.999755859375) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)cdf(this,x);
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type_conflict6 *)&local_48);
    x = x + 1;
  }
  local_28 = 1.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_28);
  return;
}

Assistant:

void calc_probabilities() {
        P_ = std::vector<double>();
        int x{0};
        double p{0.0};
        while (p < 1.0 - 1.0 / 4096.0) {
          p = cdf(x);
          P_.push_back(p);
          ++x;
        }
        P_.push_back(1);
      }